

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_ManCreateVars(Ses_Man_t *pSes,int nGates)

{
  sat_solver *psVar1;
  int local_1c;
  int local_18;
  int i;
  int nGates_local;
  Ses_Man_t *pSes_local;
  
  if (pSes->fSatVerbose != 0) {
    printf("create variables for network with %d functions over %d variables and %d/%d gates\n",
           (ulong)(uint)pSes->nSpecFunc,(ulong)(uint)pSes->nSpecVars,(ulong)(uint)nGates,
           (ulong)(uint)pSes->nMaxGates);
  }
  pSes->nGates = nGates;
  pSes->nSimVars = nGates * pSes->nRows;
  pSes->nOutputVars = pSes->nSpecFunc * nGates;
  pSes->nGateVars = nGates * 3;
  pSes->nSelectVars = 0;
  for (local_18 = pSes->nSpecVars; local_18 < pSes->nSpecVars + nGates; local_18 = local_18 + 1) {
    pSes->nSelectVars = (local_18 * (local_18 + -1)) / 2 + pSes->nSelectVars;
  }
  if (pSes->nMaxDepth < 1) {
    local_1c = 0;
  }
  else {
    local_1c = nGates * pSes->nArrTimeMax + (nGates * (nGates + 1)) / 2;
  }
  pSes->nDepthVars = local_1c;
  pSes->nDepthOffset = 0;
  pSes->nSelectOffset = pSes->nDepthVars;
  pSes->nGateOffset = pSes->nDepthVars + pSes->nSelectVars;
  pSes->nOutputOffset = pSes->nDepthVars + pSes->nSelectVars + pSes->nGateVars;
  pSes->nSimOffset = pSes->nDepthVars + pSes->nSelectVars + pSes->nGateVars + pSes->nOutputVars;
  if (pSes->pSat == (sat_solver *)0x0) {
    psVar1 = sat_solver_new();
    pSes->pSat = psVar1;
  }
  else {
    sat_solver_restart(pSes->pSat);
  }
  sat_solver_setnvars(pSes->pSat,
                      pSes->nSimVars + pSes->nOutputVars + pSes->nGateVars + pSes->nSelectVars +
                      pSes->nDepthVars);
  return;
}

Assistant:

static void Ses_ManCreateVars( Ses_Man_t * pSes, int nGates )
{
    int i;

    if ( pSes->fSatVerbose )
    {
        printf( "create variables for network with %d functions over %d variables and %d/%d gates\n", pSes->nSpecFunc, pSes->nSpecVars, nGates, pSes->nMaxGates );
    }

    pSes->nGates      = nGates;
    pSes->nSimVars    = nGates * pSes->nRows;
    pSes->nOutputVars = pSes->nSpecFunc * nGates;
    pSes->nGateVars   = nGates * 3;
    pSes->nSelectVars = 0;
    for ( i = pSes->nSpecVars; i < pSes->nSpecVars + nGates; ++i )
        pSes->nSelectVars += ( i * ( i - 1 ) ) / 2;
    pSes->nDepthVars = pSes->nMaxDepth > 0 ? nGates * pSes->nArrTimeMax + ( nGates * ( nGates + 1 ) ) / 2 : 0;

    /* pSes->nSimOffset    = 0; */
    /* pSes->nOutputOffset = pSes->nSimVars; */
    /* pSes->nGateOffset   = pSes->nSimVars + pSes->nOutputVars; */
    /* pSes->nSelectOffset = pSes->nSimVars + pSes->nOutputVars + pSes->nGateVars; */
    /* pSes->nDepthOffset  = pSes->nSimVars + pSes->nOutputVars + pSes->nGateVars + pSes->nSelectVars; */

    pSes->nDepthOffset  = 0;
    pSes->nSelectOffset = pSes->nDepthVars;
    pSes->nGateOffset   = pSes->nDepthVars + pSes->nSelectVars;
    pSes->nOutputOffset = pSes->nDepthVars + pSes->nSelectVars + pSes->nGateVars;
    pSes->nSimOffset    = pSes->nDepthVars + pSes->nSelectVars + pSes->nGateVars + pSes->nOutputVars;

    /* pSes->nDepthOffset  = 0; */
    /* pSes->nSelectOffset = pSes->nDepthVars; */
    /* pSes->nOutputOffset = pSes->nDepthVars + pSes->nSelectVars; */
    /* pSes->nGateOffset   = pSes->nDepthVars + pSes->nSelectVars + pSes->nOutputVars; */
    /* pSes->nSimOffset    = pSes->nDepthVars + pSes->nSelectVars + pSes->nOutputVars + pSes->nGateVars; */

    /* if we already have a SAT solver, then restart it (this saves a lot of time) */
    if ( pSes->pSat )
        sat_solver_restart( pSes->pSat );
    else
        pSes->pSat = sat_solver_new();
    sat_solver_setnvars( pSes->pSat, pSes->nSimVars + pSes->nOutputVars + pSes->nGateVars + pSes->nSelectVars + pSes->nDepthVars );
}